

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O3

void __thiscall
ON_SubDEdgeIterator::Internal_Init
          (ON_SubDEdgeIterator *this,ON_SubDRef *subd_ref,uint edge_count,ON_SubDEdge *first,
          ON_SubDEdge *last,ON_SubDComponentPtr component_ptr)

{
  Type TVar1;
  ON_SubDComponentPtr *pOVar2;
  ON_SubDComponentPtr local_28;
  
  pOVar2 = &local_28;
  local_28.m_ptr = component_ptr.m_ptr;
  ON_SubDRef::operator=(&this->m_subd_ref,subd_ref);
  if (((edge_count != 0) && (first != (ON_SubDEdge *)0x0)) && (last != (ON_SubDEdge *)0x0)) {
    this->m_e_first = first;
    this->m_e_last = last;
    this->m_e_current = first;
    this->m_edge_count = edge_count;
    TVar1 = ON_SubDComponentPtr::ComponentType(&local_28);
    if (TVar1 == Unset) {
      pOVar2 = &ON_SubDComponentPtr::Null;
    }
    (this->m_component_ptr).m_ptr = pOVar2->m_ptr;
  }
  return;
}

Assistant:

void ON_SubDEdgeIterator::Internal_Init(
  const ON_SubDRef& subd_ref,
  unsigned int edge_count,
  const ON_SubDEdge* first,
  const ON_SubDEdge* last,
  ON_SubDComponentPtr component_ptr
)
{
  m_subd_ref = subd_ref;
  if (nullptr != first && nullptr != last && edge_count > 0)
  {
    m_e_first = first;
    m_e_last = last;
    m_e_current = m_e_first;
    m_edge_count = edge_count;
    m_component_ptr
      = (ON_SubDComponentPtr::Type::Unset == component_ptr.ComponentType())
      ? ON_SubDComponentPtr::Null
      : component_ptr;
  }
}